

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<std::complex<long_double>_>::Write
          (TPZDohrSubstructCondense<std::complex<long_double>_> *this,TPZStream *out,int withclassid
          )

{
  _Rb_tree_header *p_Var1;
  TPZReference *pTVar2;
  TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *pTVar3;
  ostream *poVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  _Self __tmp;
  int a;
  int one;
  int b;
  int sc;
  int four;
  int three;
  int two;
  _Rb_tree_color local_4c [3];
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  pTVar2 = (this->fMatRedComplete).fRef;
  if ((pTVar2 == (TPZReference *)0x0) ||
     (pTVar2->fPointer ==
      (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *)0x0)) {
    local_4c[1] = 0;
    (*out->_vptr_TPZStream[3])(out,local_4c + 1,1);
  }
  else {
    local_4c[1] = 1;
    (*out->_vptr_TPZStream[3])(out,local_4c + 1,1);
    pTVar3 = ((this->fMatRedComplete).fRef)->fPointer;
    (*(pTVar3->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[5])(pTVar3,out,0);
  }
  (*out->_vptr_TPZStream[3])(out,&this->fNEquations,1);
  (*out->_vptr_TPZStream[3])(out,&this->fNumInternalEquations,1);
  (*out->_vptr_TPZStream[3])(out,&this->fNumExternalEquations,1);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,this->fNEquations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->fNumInternalEquations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  plVar5 = (long *)std::ostream::operator<<(poVar4,this->fNumExternalEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  TPZStream::Write<int>(out,&this->fCoarseNodes);
  poVar4 = ::operator<<((ostream *)&std::cout,&this->fCoarseNodes);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_4c[1] = 1;
  local_34 = 2;
  local_38 = 3;
  local_3c = 4;
  (*out->_vptr_TPZStream[3])(out,local_4c + 1,1);
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fPhiC,out,0);
  (*out->_vptr_TPZStream[3])(out,&local_34,1);
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fPhiC_Weighted_Condensed,out,0);
  (*out->_vptr_TPZStream[3])(out,&local_38,1);
  TPZStream::Write<std::complex<long_double>>
            (out,&(this->fWeights).super_TPZVec<std::complex<long_double>_>);
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fKCi,out,0);
  (*out->_vptr_TPZStream[3])(out,&local_3c,1);
  local_40 = (undefined4)
             (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (*out->_vptr_TPZStream[3])(out,&local_40,1);
  p_Var6 = (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      local_4c[0] = p_Var6[1]._M_color;
      local_4c[2] = *(_Rb_tree_color *)&p_Var6[1].field_0x4;
      (*out->_vptr_TPZStream[3])(out,local_4c,1);
      (*out->_vptr_TPZStream[3])(out,local_4c + 2,1);
      TPZStream::Write<int>(out,(TPZVec<int> *)&p_Var6[1]._M_parent);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  pTVar2 = (this->fMatRed).fRef;
  if ((pTVar2 == (TPZReference *)0x0) ||
     (pTVar2->fPointer ==
      (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *)0x0)) {
    local_4c[0] = _S_red;
    (*out->_vptr_TPZStream[3])(out,local_4c,1);
  }
  else {
    local_4c[0] = _S_black;
    (*out->_vptr_TPZStream[3])(out,local_4c,1);
    pTVar3 = ((this->fMatRed).fRef)->fPointer;
    (*(pTVar3->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[5])(pTVar3,out,0);
  }
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fLocalLoad,out,0);
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fLocalWeightedResidual,out,0);
  TPZFMatrix<std::complex<long_double>_>::Write(&this->fAdjustSolution,out,0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Write(TPZStream &out, int withclassid) const
{    
    SAVEABLE_STR_NOTE(out,"fMatRedComplete");
    if(fMatRedComplete)
    {
        int one = 1;
        out.Write(&one);
        fMatRedComplete->Write(out,0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    SAVEABLE_STR_NOTE(out,"fNEquations");
    out.Write(&fNEquations);
    SAVEABLE_STR_NOTE(out,"fNumInternalEquations");
    out.Write(&fNumInternalEquations);
    SAVEABLE_STR_NOTE(out,"fNumExternalEquations");
    out.Write(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    out.Write( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(1),two(2),three(3),four(4);
    
    out.Write(&one);
    fPhiC.Write(out, 0);
    out.Write(&two);
    fPhiC_Weighted_Condensed.Write(out, 0);
    out.Write(&three);
    out.Write( fWeights);
    fKCi.Write(out, 0);
    out.Write(&four);
    typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator it;
    int sc = fPermutationsScatter.size();
    out.Write(&sc);
    for (it=fPermutationsScatter.begin(); it != fPermutationsScatter.end(); it++) {
        int a = it->first.first;
        int b = it->first.second;
        out.Write(&a);
        out.Write(&b);
        out.Write( it->second);
    }
    if (fMatRed) {
        int one = 1;
        out.Write(&one);
        fMatRed->Write(out, 0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    
    fLocalLoad.Write(out, 0);
    fLocalWeightedResidual.Write(out, 0);
    fAdjustSolution.Write(out, 0);

}